

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int *activateScaling)

{
  undefined1 auVar1 [16];
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int *in_stack_00000008;
  int expTmp;
  int j;
  float sum2;
  float sum1;
  int i;
  int w;
  int k;
  int v;
  int u;
  int l;
  int local_58;
  int local_54;
  float local_50;
  float local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
    local_38 = local_34 * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x14);
    local_3c = local_34 * *(int *)(in_RDI + 0x2c) * *(int *)(in_RDI + 0x14);
    for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x14); local_40 = local_40 + 1) {
      local_44 = local_34 * *(int *)(in_RDI + 0x40);
      for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x24); local_48 = local_48 + 1) {
        local_4c = 0.0;
        local_50 = 0.0;
        for (local_54 = 0; local_54 < *(int *)(in_RDI + 0x24); local_54 = local_54 + 1) {
          auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_18 + (long)(local_3c + local_54) * 4)),
                                   ZEXT416(*(uint *)(local_20 + (long)local_44 * 4)),
                                   ZEXT416((uint)local_4c));
          local_4c = auVar1._0_4_;
          auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(local_28 + (long)(local_3c + local_54) * 4)),
                                   ZEXT416(*(uint *)(local_30 + (long)local_44 * 4)),
                                   ZEXT416((uint)local_50));
          local_50 = auVar1._0_4_;
          local_44 = local_44 + 1;
        }
        local_44 = local_44 + 1;
        *(float *)(local_10 + (long)local_38 * 4) = local_4c * local_50;
        if (*in_stack_00000008 == 0) {
          frexp((double)*(float *)(local_10 + (long)local_38 * 4),&local_58);
          iVar2 = local_58;
          if (local_58 < 1) {
            iVar2 = -local_58;
          }
          if (*(int *)(in_RDI + 100) < iVar2) {
            *in_stack_00000008 = 1;
          }
        }
        local_38 = local_38 + 1;
      }
      local_3c = *(int *)(in_RDI + 0x2c) + local_3c;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                               const REALTYPE* partials1,
                                                               const REALTYPE* matrices1,
                                                               const REALTYPE* partials2,
                                                               const REALTYPE* matrices2,
                                                               int* activateScaling) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*kPartialsPaddedStateCount*kPatternCount;
        int v = l*kPartialsPaddedStateCount*kPatternCount;
        for (int k = 0; k < kPatternCount; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                REALTYPE sum1 = 0.0, sum2 = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sum1 += matrices1[w] * partials1[v + j];
                    sum2 += matrices2[w] * partials2[v + j];
                    w++;
                }

                // increment for the extra column at the end
                w += T_PAD;

                destP[u] = sum1 * sum2;

                if (*activateScaling == 0) {
                    int expTmp;
                    frexp(destP[u], &expTmp);
                    if (abs(expTmp) > scalingExponentThreshold)
                        *activateScaling = 1;
                }

                u++;
            }
            u += P_PAD;
            v += kPartialsPaddedStateCount;
        }
    }
}